

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

_Bool extents_init(tsdn_t *tsdn,extents_t *extents,extent_state_t state,_Bool delay_coalesce)

{
  _Bool _Var1;
  undefined1 in_CL;
  undefined4 in_EDX;
  bitmap_t *in_RSI;
  uint i;
  malloc_mutex_lock_order_t in_stack_ffffffffffffffa8;
  witness_rank_t in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  malloc_mutex_t *in_stack_ffffffffffffffb8;
  uint uVar2;
  undefined3 in_stack_ffffffffffffffc8;
  uint uVar3;
  byte bVar4;
  _Bool local_1d;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffc8) & 0x1ffffff;
  _Var1 = malloc_mutex_init(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (_Var1) {
    local_1d = true;
  }
  else {
    for (uVar2 = 0; uVar2 < 200; uVar2 = uVar2 + 1) {
      extent_heap_new((extent_heap_t *)0x164c4f);
    }
    bitmap_init(in_RSI,(bitmap_info_t *)CONCAT44(in_EDX,uVar3),SUB41(uVar2 >> 0x18,0));
    bVar4 = (byte)(uVar3 >> 0x18);
    extent_list_init((extent_list_t *)(in_RSI + 0x26a));
    in_RSI[0x26b] = 0;
    *(undefined4 *)(in_RSI + 0x26c) = in_EDX;
    *(byte *)((long)in_RSI + 0x1364) = bVar4 & 1;
    local_1d = false;
  }
  return local_1d;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}